

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2897ce::ArgParser::argPages(ArgParser *this)

{
  allocator<char> local_41;
  string local_40;
  shared_ptr<QPDFJob::PagesConfig> local_20;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->accumulated_args);
  std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &this->c_main);
  QPDFJob::Config::pages((Config *)&local_20);
  std::shared_ptr<QPDFJob::PagesConfig>::operator=(&this->c_pages,&local_20);
  std::shared_ptr<QPDFJob::PagesConfig>::~shared_ptr(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"pages",&local_41);
  QPDFArgParser::selectOptionTable(&this->ap,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void
ArgParser::argPages()
{
    this->accumulated_args.clear();
    this->c_pages = c_main->pages();
    this->ap.selectOptionTable(O_PAGES);
}